

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O2

void __thiscall Assimp::DXF::PolyLine::~PolyLine(PolyLine *this)

{
  std::__cxx11::string::~string((string *)&this->desc);
  std::__cxx11::string::~string((string *)&this->layer);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~_Vector_base
            (&(this->colors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            ((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this);
  return;
}

Assistant:

PolyLine()
    : flags() {
        // empty
    }